

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask5_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  vpmovsxbd_avx(ZEXT416(0x5c4c3018));
  auVar4 = vpinsrd_avx(ZEXT416(in[2]),in[8],1);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_00191b80);
  uVar1 = in[7] << 3;
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar3 = vpshufd_avx(auVar2,0xaa);
  auVar4 = vpinsrd_avx(auVar4,in[0xf] << 0xb,2);
  auVar5 = vpsrld_avx(auVar3,1);
  auVar3 = vpinsrd_avx(ZEXT416(in[1] << 5 | *in),auVar2._0_4_ >> 2 | uVar1,1);
  auVar3 = vpinsrd_avx(auVar3,auVar2._4_4_ >> 4 | in[0xe] << 6 | in[0xd] * 2,2);
  auVar4 = vpor_avx(auVar4,auVar3);
  auVar4 = vpblendd_avx2(auVar4,auVar5,8);
  vpmovsxbd_avx(ZEXT416(0x5040240c));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar3 = vpsllvd_avx2(auVar3,_DAT_0019d1c0);
  vpmovsxbd_avx(ZEXT416(0x54442810));
  auVar5 = vpgatherdd_avx512vl(*in);
  auVar5 = vpsllvd_avx2(auVar5,_DAT_0019d1e0);
  auVar5 = vpternlogd_avx512vl(auVar5,auVar3,auVar4,0xfe);
  vpmovsxbd_avx(ZEXT416(0x58482c14));
  auVar4 = vpsllvd_avx2(auVar2,_DAT_0019d210);
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)(out + 4)));
  auVar3 = vpsllvd_avx2(auVar3,_DAT_0019d200);
  auVar4 = vpternlogd_avx512vl(auVar4,auVar3,auVar5,0xfe);
  *(undefined1 (*) [16])out = auVar4;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask5_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (5 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (5 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 19;
  ++in;

  return out + 1;
}